

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_double(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  double in_RAX;
  undefined8 uVar6;
  undefined8 uVar7;
  char extraout_var_00;
  long extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  int extraout_var;
  long extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  DIR *__dirp;
  dirent *pdVar17;
  FILE *__stream;
  long lVar18;
  uint extraout_EDX;
  char *__dest;
  ulong uVar19;
  char *pcVar20;
  DIR *__s;
  DIR *__name;
  char *pcVar21;
  DIR *pDVar22;
  DIR *__filename;
  undefined8 uVar23;
  DIR *pDVar24;
  undefined1 *puVar25;
  char *pcVar26;
  char *pcVar27;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  double val;
  undefined1 auStack_7698 [8];
  undefined1 auStack_7690 [504];
  ulong uStack_7498;
  DIR *pDStack_7490;
  char *pcStack_7488;
  DIR *pDStack_7480;
  DIR *pDStack_7478;
  int iStack_746c;
  DIR *pDStack_7468;
  stat sStack_7460;
  char acStack_73d0 [512];
  size_t sStack_71d0;
  char *pcStack_71c8;
  DIR *pDStack_71c0;
  char *pcStack_71b8;
  code *pcStack_71b0;
  char *pcStack_71a8;
  ulong uStack_71a0;
  char *pcStack_7198;
  DIR *pDStack_7190;
  undefined8 *puStack_7188;
  undefined8 uStack_7150;
  undefined1 *puStack_7148;
  undefined1 *puStack_7140;
  undefined1 auStack_7130 [8];
  char *pcStack_7128;
  undefined8 uStack_7118;
  char *pcStack_7110;
  undefined8 uStack_7108;
  undefined8 uStack_70f0;
  DIR aDStack_7080 [25944];
  char *pcStack_b28;
  char *pcStack_b20;
  char *pcStack_b18;
  char *pcStack_b10;
  code *apcStack_b08 [2];
  undefined1 auStack_af8 [116];
  uint uStack_a84;
  char acStack_a80 [256];
  undefined8 uStack_980;
  char *pcStack_978;
  char *pcStack_970;
  char *pcStack_968;
  char *pcStack_960;
  char *pcStack_958;
  char *pcStack_950;
  undefined8 uStack_948;
  code *pcStack_940;
  char *pcStack_938;
  undefined8 uStack_930;
  char *pcStack_928;
  char *pcStack_920;
  char *pcStack_918;
  char *pcStack_910;
  code *pcStack_908;
  undefined8 uStack_900;
  undefined8 uStack_8f8;
  char *pcStack_8f0;
  char *pcStack_8e8;
  char *pcStack_8e0;
  undefined8 uStack_8d8;
  bson_t *pbStack_8d0;
  char *pcStack_8c8;
  code *pcStack_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  char *pcStack_8a0;
  char *pcStack_898;
  char *pcStack_890;
  char *pcStack_888;
  char *pcStack_880;
  code *pcStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined1 *puStack_858;
  char *pcStack_850;
  char *pcStack_848;
  code *pcStack_840;
  undefined8 uStack_838;
  ulong uStack_830;
  ulong uStack_828;
  undefined1 *puStack_820;
  char *pcStack_818;
  void *pvStack_810;
  code *pcStack_808;
  uint uStack_784;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  ulong uStack_630;
  ulong uStack_628;
  undefined1 *puStack_620;
  char *pcStack_618;
  void *pvStack_610;
  code *apcStack_608 [16];
  uint uStack_584;
  undefined1 auStack_580 [4];
  uint uStack_57c;
  undefined8 uStack_438;
  ulong uStack_430;
  undefined1 *puStack_428;
  char *pcStack_420;
  undefined8 uStack_418;
  code *apcStack_410 [2];
  undefined8 uStack_400;
  code *pcStack_3f8;
  undefined8 uStack_3e8;
  code *pcStack_3e0;
  long lStack_3d8;
  undefined8 uStack_3d0;
  code *pcStack_3c8;
  undefined8 uStack_3c0;
  int iStack_3b8;
  int iStack_3b4;
  undefined8 uStack_3b0;
  char *pcStack_3a8;
  code *pcStack_3a0;
  int iStack_394;
  ulong uStack_390;
  code *pcStack_388;
  undefined8 uStack_380;
  uint uStack_30c;
  char *pcStack_308;
  undefined1 auStack_300 [4];
  uint uStack_2fc;
  undefined8 uStack_1e0;
  char *pcStack_1b0;
  undefined8 uStack_1a8;
  code *pcStack_1a0;
  char *pcStack_198;
  undefined8 uStack_190;
  code *pcStack_188;
  undefined8 uStack_180;
  undefined8 uStack_170;
  char *pcStack_168;
  undefined1 auStack_15c [12];
  undefined8 uStack_150;
  char *pcStack_148;
  code *pcStack_140;
  undefined8 uStack_138;
  char *pcStack_128;
  char *pcStack_120;
  undefined8 uStack_118;
  char *pcStack_110;
  code *pcStack_108;
  undefined8 uStack_f8;
  code *pcStack_f0;
  long lStack_e8;
  undefined8 uStack_e0;
  code *pcStack_d8;
  char cStack_c9;
  undefined8 uStack_c8;
  code *pcStack_c0;
  undefined8 uStack_b8;
  undefined1 auStack_ac [12];
  undefined8 uStack_a0;
  code *pcStack_98;
  undefined8 uStack_90;
  undefined1 *puStack_88;
  code *pcStack_80;
  int iStack_78;
  int iStack_74;
  long *plStack_70;
  undefined8 uStack_68;
  char *pcStack_60;
  long lStack_48;
  long lStack_40;
  undefined1 auStack_38 [16];
  undefined8 uStack_28;
  code *pcStack_20;
  double local_18;
  
  pcStack_20 = (code *)0x13b483;
  local_18 = in_RAX;
  uVar6 = bson_bcon_magic();
  pcStack_20 = (code *)0x13b4a9;
  uVar6 = bcon_new(0x3ff199999999999a,0,"foo",uVar6,1,0);
  pcStack_20 = (code *)0x13b4b1;
  uVar7 = bson_bcone_magic();
  pcStack_20 = (code *)0x13b4cc;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,1,&local_18,0);
  if (cVar1 == '\0') {
    pcStack_20 = (code *)0x13b4f6;
    test_double_cold_1();
  }
  else if ((local_18 == 1.1) && (!NAN(local_18))) {
    pcStack_20 = (code *)0x13b4e9;
    bson_destroy(uVar6);
    return;
  }
  pcStack_20 = test_decimal128;
  test_double_cold_2();
  pcStack_20 = (code *)0x13e3df;
  uStack_28 = uVar6;
  bson_decimal128_from_string("12",auStack_38);
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x12,auStack_38,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x12,&lStack_48,0);
  if (cVar1 == '\0') {
    test_decimal128_cold_1();
LAB_0013b593:
    test_decimal128_cold_2();
  }
  else {
    if (lStack_48 != 0xc) goto LAB_0013b593;
    if (lStack_40 == 0x3040000000000000) {
      bson_destroy(uVar6);
      return;
    }
  }
  test_decimal128_cold_3();
  pcStack_60 = "foo";
  pcStack_80 = (code *)0x13b5ab;
  uStack_68 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_80 = (code *)0x0;
  puStack_88 = (undefined1 *)0x8;
  uStack_90 = 0x13b5d7;
  uVar6 = bcon_new(0,"foo",uVar6,4,0,"deadbeef");
  pcStack_80 = (code *)0x13b5e3;
  uVar7 = bson_bcone_magic();
  pcStack_80 = (code *)0x0;
  uStack_90 = 0x13b609;
  puStack_88 = (undefined1 *)&iStack_78;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,4,&iStack_74,&plStack_70);
  if (cVar1 == '\0') {
    pcStack_80 = (code *)0x13b649;
    test_binary_cold_1();
LAB_0013b649:
    pcStack_80 = (code *)0x13b64e;
    test_binary_cold_2();
LAB_0013b64e:
    pcStack_80 = (code *)0x13b653;
    test_binary_cold_3();
  }
  else {
    if (iStack_74 != 0) goto LAB_0013b649;
    if (iStack_78 != 8) goto LAB_0013b64e;
    if (*plStack_70 == 0x6665656264616564) {
      pcStack_80 = (code *)0x13b63a;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_80 = test_undefined;
  test_binary_cold_4();
  pcStack_80 = (code *)0x13e3df;
  pcStack_98 = (code *)0x13b661;
  puStack_88 = (undefined1 *)uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_98 = (code *)0x13b67f;
  uVar6 = bcon_new(0,"foo",uVar6,5,0);
  pcStack_98 = (code *)0x13b687;
  uVar7 = bson_bcone_magic();
  pcStack_98 = (code *)0x13b69f;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,5,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_98 = test_oid;
  test_undefined_cold_1();
  pcStack_98 = (code *)0x13e3df;
  pcStack_c0 = (code *)0x13b6cd;
  uStack_a0 = uVar6;
  bson_oid_init(auStack_ac,0);
  pcStack_c0 = (code *)0x13b6d2;
  uVar6 = bson_bcon_magic();
  pcStack_c0 = (code *)0x13b6f3;
  uVar6 = bcon_new(0,"foo",uVar6,6,auStack_ac,0);
  pcStack_c0 = (code *)0x13b6fb;
  uVar7 = bson_bcone_magic();
  pcStack_c0 = (code *)0x13b716;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,6,&uStack_b8,0);
  if (cVar1 == '\0') {
    pcStack_c0 = (code *)0x13b741;
    test_oid_cold_1();
  }
  else {
    pcStack_c0 = (code *)0x13b728;
    cVar1 = bson_oid_equal(auStack_ac,uStack_b8);
    if (cVar1 != '\0') {
      pcStack_c0 = (code *)0x13b734;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_c0 = test_bool;
  test_oid_cold_2();
  pcStack_c0 = (code *)0x13e3df;
  pcStack_d8 = (code *)0x13b74f;
  uStack_c8 = uVar6;
  cStack_c9 = extraout_var_00;
  uVar6 = bson_bcon_magic();
  pcStack_d8 = (code *)0x13b773;
  uVar6 = bcon_new(0,"foo",uVar6,7,1,0);
  pcStack_d8 = (code *)0x13b77b;
  uVar7 = bson_bcone_magic();
  pcStack_d8 = (code *)0x13b798;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,7,&cStack_c9,0);
  if (cVar1 == '\0') {
    pcStack_d8 = (code *)0x13b7b8;
    test_bool_cold_1();
  }
  else if (cStack_c9 != '\0') {
    pcStack_d8 = (code *)0x13b7ab;
    bson_destroy(uVar6);
    return;
  }
  pcStack_d8 = test_date_time;
  test_bool_cold_2();
  pcStack_d8 = (code *)0x13e3df;
  pcStack_f0 = (code *)0x13b7c6;
  lStack_e8 = extraout_RAX;
  uStack_e0 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_f0 = (code *)0x13b7ea;
  uVar6 = bcon_new(0,"foo",uVar6,8,10000,0);
  pcStack_f0 = (code *)0x13b7f2;
  uVar7 = bson_bcone_magic();
  pcStack_f0 = (code *)0x13b80d;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,8,&lStack_e8,0);
  if (cVar1 == '\0') {
    pcStack_f0 = (code *)0x13b830;
    test_date_time_cold_1();
  }
  else if (lStack_e8 == 10000) {
    pcStack_f0 = (code *)0x13b823;
    bson_destroy(uVar6);
    return;
  }
  pcStack_f0 = test_null;
  test_date_time_cold_2();
  pcStack_f0 = (code *)0x13e3df;
  pcStack_108 = (code *)0x13b83e;
  uStack_f8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_108 = (code *)0x13b85c;
  uVar6 = bcon_new(0,"foo",uVar6,9,0);
  pcStack_108 = (code *)0x13b864;
  uVar7 = bson_bcone_magic();
  pcStack_108 = (code *)0x13b87c;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,9,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_108 = test_regex;
  test_null_cold_1();
  pcStack_108 = (code *)0x0;
  pcStack_110 = "foo";
  pcStack_140 = (code *)0x13b8a2;
  uStack_118 = uVar6;
  uVar6 = bson_bcon_magic();
  uStack_138 = 0;
  pcStack_140 = (code *)0x13b8d2;
  uVar6 = bcon_new(0,"foo",uVar6,10,"^foo|bar$","i");
  pcStack_140 = (code *)0x13b8da;
  uVar7 = bson_bcone_magic();
  uStack_138 = 0;
  pcStack_140 = (code *)0x13b8fd;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,10,&pcStack_120,&pcStack_128);
  if (cVar1 == '\0') {
    pcStack_140 = (code *)0x13b942;
    test_regex_cold_1();
LAB_0013b942:
    pcStack_140 = (code *)0x13b947;
    test_regex_cold_2();
  }
  else {
    pcStack_140 = (code *)0x13b912;
    iVar2 = strcmp(pcStack_120,"^foo|bar$");
    if (iVar2 != 0) goto LAB_0013b942;
    pcStack_140 = (code *)0x13b927;
    iVar2 = strcmp(pcStack_128,"i");
    if (iVar2 == 0) {
      pcStack_140 = (code *)0x13b933;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_140 = test_dbpointer;
  test_regex_cold_3();
  pcStack_140 = (code *)0x0;
  pcStack_148 = "foo";
  pcStack_188 = (code *)0x13b967;
  uStack_150 = uVar6;
  bson_oid_init(auStack_15c,0);
  pcStack_188 = (code *)0x13b96c;
  uVar6 = bson_bcon_magic();
  uStack_180 = 0;
  pcStack_188 = (code *)0x13b995;
  uVar6 = bcon_new(0,"foo",uVar6,0xb,"collection",auStack_15c);
  pcStack_188 = (code *)0x13b99d;
  uVar7 = bson_bcone_magic();
  uStack_180 = 0;
  pcStack_188 = (code *)0x13b9c0;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xb,&pcStack_168,&uStack_170);
  if (cVar1 == '\0') {
    pcStack_188 = (code *)0x13ba03;
    test_dbpointer_cold_1();
LAB_0013ba03:
    pcStack_188 = (code *)0x13ba08;
    test_dbpointer_cold_2();
  }
  else {
    pcStack_188 = (code *)0x13b9d5;
    iVar2 = strcmp(pcStack_168,"collection");
    if (iVar2 != 0) goto LAB_0013ba03;
    pcStack_188 = (code *)0x13b9e8;
    cVar1 = bson_oid_equal(uStack_170,auStack_15c);
    if (cVar1 != '\0') {
      pcStack_188 = (code *)0x13b9f4;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_188 = test_code;
  test_dbpointer_cold_3();
  pcStack_188 = (code *)0x13e3df;
  pcStack_1a0 = (code *)0x13ba16;
  pcStack_198 = extraout_RAX_00;
  uStack_190 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_1a0 = (code *)0x13ba3b;
  uVar6 = bcon_new(0,"foo",uVar6,0xc,"var a = {};",0);
  pcStack_1a0 = (code *)0x13ba43;
  uVar7 = bson_bcone_magic();
  pcStack_1a0 = (code *)0x13ba5e;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xc,&pcStack_198,0);
  if (cVar1 == '\0') {
    pcStack_1a0 = (code *)0x13ba8b;
    test_code_cold_1();
  }
  else {
    pcStack_1a0 = (code *)0x13ba72;
    iVar2 = strcmp(pcStack_198,"var a = {};");
    if (iVar2 == 0) {
      pcStack_1a0 = (code *)0x13ba7e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_1a0 = test_symbol;
  test_code_cold_2();
  pcStack_1a0 = (code *)0x13e3df;
  pcStack_1b0 = extraout_RAX_01;
  uStack_1a8 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0xd,"symbol",0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xd,&pcStack_1b0,0);
  if (cVar1 == '\0') {
    test_symbol_cold_1();
  }
  else {
    iVar2 = strcmp(pcStack_1b0,"symbol");
    if (iVar2 == 0) {
      bson_destroy(uVar6);
      return;
    }
  }
  test_symbol_cold_2();
  pcStack_388 = (code *)0x13bb30;
  uStack_1e0 = uVar6;
  pvVar8 = (void *)bson_bcon_magic();
  puVar25 = (undefined1 *)0x0;
  pcStack_388 = (code *)0x13bb57;
  uVar9 = bcon_new(0,"b",pvVar8,0xf,10,0);
  uStack_380 = 0;
  pcVar27 = "foo";
  pcStack_388 = (code *)0x13bb83;
  uVar10 = bcon_new(0,"foo",pvVar8,0xe,"var a = b;",uVar9);
  pcStack_388 = (code *)0x13bb8b;
  uVar6 = bson_bcone_magic();
  uStack_380 = 0;
  pcStack_388 = (code *)0x13bbb1;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,0xe,&pcStack_308,auStack_300);
  if (cVar1 == '\0') {
LAB_0013bd4d:
    pcStack_388 = (code *)0x13bd52;
    test_codewscope_cold_1();
LAB_0013bd52:
    pcStack_388 = (code *)0x13bd57;
    test_codewscope_cold_2();
LAB_0013bd57:
    pcStack_388 = (code *)0x13bd5c;
    test_codewscope_cold_7();
LAB_0013bd5c:
    pcStack_388 = (code *)0x13bd61;
    test_codewscope_cold_6();
LAB_0013bd61:
    pcStack_388 = (code *)0x13bd66;
    test_codewscope_cold_3();
  }
  else {
    pcStack_388 = (code *)0x13bbca;
    iVar2 = strcmp(pcStack_308,"var a = b;");
    if (iVar2 != 0) goto LAB_0013bd52;
    pcStack_388 = (code *)0x13bbe2;
    pcVar27 = (char *)bson_get_data(auStack_300);
    pcStack_388 = (code *)0x13bbed;
    pvVar8 = (void *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_2fc) {
      pcStack_388 = (code *)0x13bc01;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_388 = (code *)0x13bc11;
      pvVar12 = (void *)bson_get_data(auStack_300);
      pcStack_388 = (code *)0x13bc1f;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_388 = (code *)0x13bc30;
        bson_destroy(auStack_300);
        pcStack_388 = (code *)0x13bc38;
        bson_destroy(uVar9);
        pcStack_388 = (code *)0x13bc40;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_300;
    pcStack_388 = (code *)0x13bc61;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    pcStack_388 = (code *)0x13bc6e;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_2fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (pcVar27[uVar19] != *(char *)((long)pvVar8 + uVar19)) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_2fc != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_2fc;
      if (uStack_2fc < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    pcStack_388 = (code *)0x13bcc9;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    pcStack_388 = (code *)0x13bce1;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    pcStack_388 = (code *)0x13bcfc;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_30c = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013bd57;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013bd5c;
    uVar10 = (ulong)uStack_2fc;
    pcStack_388 = (code *)0x13bd26;
    uVar19 = write(uVar3,pcVar27,uVar10);
    if (uVar19 != uVar10) goto LAB_0013bd61;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    pcStack_388 = (code *)0x13bd3c;
    uVar19 = write(uVar4,pvVar8,uVar9);
    if (uVar19 == uVar9) {
      pcStack_388 = (code *)0x13bd4d;
      test_codewscope_cold_5();
      goto LAB_0013bd4d;
    }
  }
  pcStack_388 = test_int32;
  test_codewscope_cold_4();
  pcStack_3a0 = (code *)0x13bd74;
  uStack_390 = uVar9;
  pcStack_388 = (code *)pvVar8;
  iStack_394 = extraout_var;
  uVar6 = bson_bcon_magic();
  pcStack_3a0 = (code *)0x13bd98;
  uVar6 = bcon_new(0,"foo",uVar6,0xf,10,0);
  pcStack_3a0 = (code *)0x13bda0;
  uVar7 = bson_bcone_magic();
  pcStack_3a0 = (code *)0x13bdbd;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xf,&iStack_394,0);
  if (cVar1 == '\0') {
    pcStack_3a0 = (code *)0x13bddd;
    test_int32_cold_1();
  }
  else if (iStack_394 == 10) {
    pcStack_3a0 = (code *)0x13bdd0;
    bson_destroy(uVar6);
    return;
  }
  pcStack_3a0 = test_timestamp;
  test_int32_cold_2();
  pcStack_3a8 = "foo";
  pcStack_3c8 = (code *)0x13bdf0;
  uStack_3b0 = uVar6;
  pcStack_3a0 = (code *)pcVar27;
  uVar6 = bson_bcon_magic();
  pvVar8 = (void *)0x0;
  uStack_3c0 = 0;
  pcStack_3c8 = (code *)0x13be1e;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_3c8 = (code *)0x13be26;
  uVar7 = bson_bcone_magic();
  uStack_3c0 = 0;
  pcStack_3c8 = (code *)0x13be49;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&iStack_3b4,&iStack_3b8);
  if (cVar1 == '\0') {
    pcStack_3c8 = (code *)0x13be75;
    test_timestamp_cold_1();
LAB_0013be75:
    pcStack_3c8 = (code *)0x13be7a;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_3b4 != 100) goto LAB_0013be75;
    if (iStack_3b8 == 1000) {
      pcStack_3c8 = (code *)0x13be66;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_3c8 = test_int64;
  test_timestamp_cold_3();
  pcStack_3c8 = (code *)0x13e3df;
  pcStack_3e0 = (code *)0x13be88;
  lStack_3d8 = extraout_RAX_02;
  uStack_3d0 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_3e0 = (code *)0x13beac;
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  pcStack_3e0 = (code *)0x13beb4;
  uVar7 = bson_bcone_magic();
  pcStack_3e0 = (code *)0x13becf;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_3d8,0);
  if (cVar1 == '\0') {
    pcStack_3e0 = (code *)0x13beef;
    test_int64_cold_1();
  }
  else if (lStack_3d8 == 10) {
    pcStack_3e0 = (code *)0x13bee2;
    bson_destroy(uVar6);
    return;
  }
  pcStack_3e0 = test_maxkey;
  test_int64_cold_2();
  pcStack_3e0 = (code *)0x13e3df;
  pcStack_3f8 = (code *)0x13befd;
  uStack_3e8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_3f8 = (code *)0x13bf1b;
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  pcStack_3f8 = (code *)0x13bf23;
  uVar7 = bson_bcone_magic();
  pcStack_3f8 = (code *)0x13bf3b;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_3f8 = test_minkey;
  test_maxkey_cold_1();
  pcStack_3f8 = (code *)0x13e3df;
  apcStack_410[0] = (code *)0x13bf5c;
  uStack_400 = uVar6;
  uVar6 = bson_bcon_magic();
  apcStack_410[0] = (code *)0x13bf7a;
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  apcStack_410[0] = (code *)0x13bf82;
  uVar7 = bson_bcone_magic();
  apcStack_410[0] = (code *)0x13bf9a;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  apcStack_410[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_418 = 0;
  pcStack_420 = "foo";
  apcStack_608[0] = (code *)0x13bfe3;
  uStack_438 = uVar6;
  uStack_430 = uVar10;
  puStack_428 = puVar25;
  apcStack_410[0] = (code *)&stack0xfffffffffffffe48;
  uVar9 = bcon_new(0,"bar","baz",0);
  apcStack_608[0] = (code *)0x13bfeb;
  uVar6 = bson_bcon_magic();
  pcVar27 = "foo";
  apcStack_608[0] = (code *)0x13c00c;
  uVar10 = bcon_new(0,"foo",uVar6,2,uVar9,0);
  apcStack_608[0] = (code *)0x13c014;
  uVar6 = bson_bcone_magic();
  apcStack_608[0] = (code *)0x13c034;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,2,auStack_580,0);
  if (cVar1 == '\0') {
LAB_0013c1b7:
    apcStack_608[0] = (code *)0x13c1bc;
    test_bson_document_cold_1();
LAB_0013c1bc:
    apcStack_608[0] = (code *)0x13c1c1;
    test_bson_document_cold_6();
LAB_0013c1c1:
    apcStack_608[0] = (code *)0x13c1c6;
    test_bson_document_cold_5();
LAB_0013c1c6:
    apcStack_608[0] = (code *)0x13c1cb;
    test_bson_document_cold_2();
  }
  else {
    apcStack_608[0] = (code *)0x13c04c;
    pvVar8 = (void *)bson_get_data(auStack_580);
    apcStack_608[0] = (code *)0x13c057;
    pcVar27 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_57c) {
      apcStack_608[0] = (code *)0x13c06b;
      pvVar11 = (void *)bson_get_data(uVar9);
      apcStack_608[0] = (code *)0x13c07b;
      pvVar12 = (void *)bson_get_data(auStack_580);
      apcStack_608[0] = (code *)0x13c089;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        apcStack_608[0] = (code *)0x13c09a;
        bson_destroy(auStack_580);
        apcStack_608[0] = (code *)0x13c0a2;
        bson_destroy(uVar9);
        apcStack_608[0] = (code *)0x13c0aa;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_580;
    apcStack_608[0] = (code *)0x13c0cb;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    apcStack_608[0] = (code *)0x13c0d8;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_57c != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar8 + uVar19) != pcVar27[uVar19]) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_57c != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_57c;
      if (uStack_57c < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    apcStack_608[0] = (code *)0x13c133;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    apcStack_608[0] = (code *)0x13c14b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    apcStack_608[0] = (code *)0x13c166;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_584 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c1bc;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c1c1;
    uVar10 = (ulong)uStack_57c;
    apcStack_608[0] = (code *)0x13c190;
    uVar19 = write(uVar3,pvVar8,uVar10);
    if (uVar19 != uVar10) goto LAB_0013c1c6;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    apcStack_608[0] = (code *)0x13c1a6;
    uVar19 = write(uVar4,pcVar27,uVar9);
    if (uVar19 == uVar9) {
      apcStack_608[0] = (code *)0x13c1b7;
      test_bson_document_cold_4();
      goto LAB_0013c1b7;
    }
  }
  apcStack_608[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_808 = (code *)0x13c201;
  uStack_630 = uVar9;
  uStack_628 = uVar10;
  puStack_620 = puVar25;
  pcStack_618 = pcVar27;
  pvStack_610 = pvVar8;
  apcStack_608[0] = (code *)apcStack_410;
  uVar9 = bcon_new(0,"0","baz",0);
  pcStack_808 = (code *)0x13c209;
  uVar6 = bson_bcon_magic();
  pcVar27 = "foo";
  pcStack_808 = (code *)0x13c22a;
  uVar10 = bcon_new(0,"foo",uVar6,3,uVar9,0);
  pcStack_808 = (code *)0x13c232;
  uVar6 = bson_bcone_magic();
  pcStack_808 = (code *)0x13c252;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,3,auStack_780,0);
  if (cVar1 == '\0') {
LAB_0013c3d5:
    pcStack_808 = (code *)0x13c3da;
    test_bson_array_cold_1();
LAB_0013c3da:
    pcStack_808 = (code *)0x13c3df;
    test_bson_array_cold_6();
LAB_0013c3df:
    pcStack_808 = (code *)0x13c3e4;
    test_bson_array_cold_5();
LAB_0013c3e4:
    pcStack_808 = (code *)0x13c3e9;
    test_bson_array_cold_2();
  }
  else {
    pcStack_808 = (code *)0x13c26a;
    pvVar8 = (void *)bson_get_data(auStack_780);
    pcStack_808 = (code *)0x13c275;
    pcVar27 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_77c) {
      pcStack_808 = (code *)0x13c289;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_808 = (code *)0x13c299;
      pvVar12 = (void *)bson_get_data(auStack_780);
      pcStack_808 = (code *)0x13c2a7;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_808 = (code *)0x13c2b8;
        bson_destroy(auStack_780);
        pcStack_808 = (code *)0x13c2c0;
        bson_destroy(uVar9);
        pcStack_808 = (code *)0x13c2c8;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_780;
    pcStack_808 = (code *)0x13c2e9;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    pcStack_808 = (code *)0x13c2f6;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_77c != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar8 + uVar19) != pcVar27[uVar19]) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_77c != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_77c;
      if (uStack_77c < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    pcStack_808 = (code *)0x13c351;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    pcStack_808 = (code *)0x13c369;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    pcStack_808 = (code *)0x13c384;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_784 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c3da;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c3df;
    uVar10 = (ulong)uStack_77c;
    pcStack_808 = (code *)0x13c3ae;
    uVar19 = write(uVar3,pvVar8,uVar10);
    if (uVar19 != uVar10) goto LAB_0013c3e4;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    pcStack_808 = (code *)0x13c3c4;
    uVar19 = write(uVar4,pcVar27,uVar9);
    if (uVar19 == uVar9) {
      pcStack_808 = (code *)0x13c3d5;
      test_bson_array_cold_4();
      goto LAB_0013c3d5;
    }
  }
  pcStack_808 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_840 = (code *)0x13c3fe;
  uStack_838 = extraout_RAX_03;
  uStack_830 = uVar9;
  uStack_828 = uVar10;
  puStack_820 = puVar25;
  pcStack_818 = pcVar27;
  pvStack_810 = pvVar8;
  pcStack_808 = (code *)apcStack_608;
  uStack_868 = bson_bcon_magic();
  pcStack_848 = (char *)0x0;
  pcStack_850 = "]";
  puStack_858 = (undefined1 *)0x2;
  uStack_860 = 0xf;
  uStack_870 = 0x13c446;
  uVar6 = bcon_new(0,"foo","[",uStack_868,0xf,1);
  pcStack_840 = (code *)0x13c452;
  uStack_868 = bson_bcone_magic();
  pcStack_848 = (char *)0x0;
  pcStack_850 = "]";
  uStack_860 = 0xf;
  uStack_870 = 0x13c481;
  puStack_858 = (undefined1 *)&uStack_838;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_868,0xf,(long)&uStack_838 + 4);
  if (cVar1 == '\0') {
    pcStack_840 = (code *)0x13c4b2;
    test_inline_array_cold_1();
LAB_0013c4b2:
    pcStack_840 = (code *)0x13c4b7;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_838._4_4_ != 1) goto LAB_0013c4b2;
    if ((int)uStack_838 == 2) {
      pcStack_840 = (code *)0x13c49e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_840 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_840 = (code *)0x147feb;
  pcStack_848 = "[";
  pcStack_850 = "foo";
  puStack_858 = (undefined1 *)0x0;
  uStack_860 = 0xf;
  pcStack_878 = (code *)0x13c4cc;
  uStack_870 = extraout_RAX_04;
  uStack_868 = uVar6;
  pcStack_8a0 = (char *)bson_bcon_magic();
  pcStack_880 = (char *)0x0;
  pcStack_888 = "}";
  pcStack_890 = (char *)0x1;
  pcStack_898 = (char *)0xf;
  uStack_8a8 = "a";
  uStack_8b0 = 2;
  uStack_8b8 = 0x13c51f;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_8a0,0xf);
  pcStack_878 = (code *)0x13c52b;
  pcStack_8a0 = (char *)bson_bcone_magic();
  uStack_8b0 = (long)&uStack_870 + 4;
  pcStack_880 = (char *)0x0;
  pcStack_888 = "}";
  pcStack_898 = (char *)0xf;
  uStack_8a8 = "b";
  uStack_8b8 = 0x13c56e;
  pcStack_890 = (char *)&uStack_870;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_8a0,0xf);
  if (cVar1 == '\0') {
    pcStack_878 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_878 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_870._4_4_ != 1) goto LAB_0013c59f;
    if ((int)uStack_870 == 2) {
      pcStack_878 = (code *)0x13c58b;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_878 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_878 = (code *)0x0;
  pcStack_880 = "a";
  pcStack_890 = "{";
  pcStack_898 = "foo";
  pcStack_8a0 = "}";
  pcStack_8c0 = (code *)0x13c5bc;
  pcStack_888 = (char *)uVar6;
  uStack_8f8 = (undefined8 *)bson_bcon_magic();
  pcStack_8c0 = (code *)0x0;
  pcStack_8c8 = (char *)0x3;
  pbStack_8d0 = (bson_t *)0xf;
  pcStack_8e0 = "c";
  pcStack_8e8 = (char *)0x2;
  pcStack_8f0 = (char *)0xf;
  uStack_900 = 0x13c5fe;
  uStack_8d8 = uStack_8f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_8f8,0xf,1,"b");
  pcStack_8c0 = (code *)0x13c60a;
  pcStack_908 = (code *)bson_bcone_magic();
  pbStack_8d0 = (bson_t *)((long)&uStack_8b0 + 4);
  uStack_8f8 = &uStack_8a8;
  pcStack_8c8 = (char *)0x0;
  uStack_8d8 = 0xf;
  pcStack_8e8 = "c";
  pcStack_8f0 = (char *)0x0;
  uStack_900 = 0xf;
  pcStack_910 = "b";
  pcStack_918 = (char *)0x0;
  pcStack_920 = (char *)0x13c656;
  pcStack_8e0 = (char *)pcStack_908;
  test_extract_ctx_helper(bson,3,"a",pcStack_908,0xf,(long)&uStack_8a8 + 4);
  if (uStack_8a8._4_4_ == 1) {
    if ((int)uStack_8a8 != 2) goto LAB_0013c68b;
    if (uStack_8b0._4_4_ == 3) {
      pcStack_8c0 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_8c0 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_8c0 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_8c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_8c0 = (code *)0xf;
  pcStack_8c8 = "a";
  uStack_8d8 = 0;
  pcStack_8e8 = "c";
  pcStack_908 = (code *)0x13c6a8;
  pcStack_8e0 = (char *)((long)&uStack_8a8 + 4);
  pbStack_8d0 = bson;
  uStack_930 = bson_bcon_magic();
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_920 = (char *)0xa;
  pcStack_928 = (char *)0xf;
  pcStack_938 = (char *)0x13c6fd;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_908 = (code *)0x13c709;
  uStack_930 = bson_bcone_magic();
  pcStack_920 = (char *)((long)&uStack_8f8 + 4);
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_928 = (char *)0xf;
  pcStack_938 = "bar";
  pcStack_940 = (code *)0x13f9a8;
  uStack_948 = 0x13c745;
  cVar1 = bcon_extract(uVar6,"hello",uStack_930,0,&pcStack_8f0,"foo");
  if (cVar1 == '\0') {
    pcStack_908 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_908 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_908 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_8f0);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_8f8._4_4_ == 10) {
      pcStack_908 = (code *)0x13c771;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_908 = test_skip;
  test_nested_cold_3();
  pcStack_908 = (code *)0x148ce7;
  pcStack_910 = "bar";
  pcStack_918 = (char *)0x0;
  pcStack_920 = "hello";
  pcStack_928 = "foo";
  pcStack_940 = (code *)0x13c79f;
  uStack_930 = uVar6;
  pcStack_968 = (char *)bson_bcon_magic();
  uStack_948 = 0;
  pcStack_950 = "}";
  pcStack_958 = (char *)0xa;
  pcStack_960 = (char *)0xf;
  pcStack_970 = (char *)0x13c7f2;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_940 = (code *)0x13c7fe;
  pcVar27 = (char *)bson_bcone_magic();
  pcVar26 = "}";
  uStack_948 = 0;
  pcStack_950 = "}";
  pcStack_958 = (char *)0x10;
  pcStack_960 = (char *)0x1c;
  pcStack_970 = "bar";
  pcStack_978 = "{";
  uStack_980 = 0x13c83a;
  pcStack_968 = pcVar27;
  cVar1 = bcon_extract(uVar6,"hello",pcVar27,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_940 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_948 = 0;
    pcStack_950 = "}";
    pcStack_958 = (char *)0x12;
    pcStack_960 = (char *)0x1c;
    pcStack_970 = "bar";
    pcStack_978 = "{";
    uStack_980 = 0x13c879;
    pcStack_968 = pcVar27;
    cVar1 = bcon_extract(uVar6,"hello",pcVar27,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_940 = test_iter;
  test_skip_cold_2();
  pcStack_940 = (code *)0x14c89e;
  pcStack_950 = "bar";
  pcStack_958 = "}";
  pcStack_968 = "{";
  apcStack_b08[0] = (code *)0x13c8be;
  pcStack_960 = pcVar27;
  uStack_948 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_b08[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_b08[0] = (code *)0x13c8ed;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_a80;
  pcVar20 = "foo";
  uVar7 = 0x1d;
  uVar23 = 0;
  apcStack_b08[0] = (code *)0x13c90d;
  pcVar21 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  uVar6 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_b08[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_b08[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_b08[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_b08[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_b08[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar21 = acStack_a80;
    apcStack_b08[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar21 = acStack_a80;
    apcStack_b08[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar23 = 0;
    apcStack_b08[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_a80);
    apcStack_b08[0] = (code *)0x13c96f;
    pcVar27 = (char *)bson_get_data(__n_00);
    apcStack_b08[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_b08[0] = (code *)0x13c98e;
      pvVar8 = (void *)bson_get_data(__n);
      apcStack_b08[0] = (code *)0x13c999;
      pvVar11 = (void *)bson_get_data(__n_00);
      apcStack_b08[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar8,pvVar11,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_b08[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_b08[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_b08[0] = (code *)0x13c9d4;
    uVar7 = bson_as_canonical_extended_json(__n_00);
    apcStack_b08[0] = (code *)0x13c9e1;
    pcVar13 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar9 = 0xffffffff;
    if (uVar3 != 0) {
      uVar10 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar10) break;
        if (pcVar27[uVar10] != __buf[uVar10]) {
          uVar9 = uVar10 & 0xffffffff;
          break;
        }
        uVar10 = uVar10 + 1;
      } while (uVar3 != (uint)uVar10);
    }
    if ((int)uVar9 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar9 = (ulong)(uVar3 - 1);
    }
    apcStack_b08[0] = (code *)0x13ca3c;
    uVar6 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9);
    apcStack_b08[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar26 = (char *)(ulong)uVar3;
    pcVar21 = "failure.expected.bson";
    pcVar20 = (char *)0x42;
    apcStack_b08[0] = (code *)0x13ca6f;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_a84 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (uVar4 == 0xffffffff) goto LAB_0013cad0;
    pcVar26 = (char *)(ulong)uVar4;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar21 = (char *)(ulong)uVar3;
    apcStack_b08[0] = (code *)0x13ca95;
    pcVar20 = pcVar27;
    pcVar14 = (char *)write(uVar3,pcVar27,(size_t)__n_00);
    if (pcVar14 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_b08[0] = (code *)0x13caab;
      pcVar20 = __buf;
      pcVar21 = pcVar26;
      pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
      if (pcVar14 != __n) goto LAB_0013cada;
      pcVar21 = (char *)(ulong)uStack_a84;
      pcVar20 = (char *)(ulong)uVar4;
      apcStack_b08[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_b08[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_b08[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_7140 = auStack_7130;
  if (extraout_AL != '\0') {
    uStack_70f0 = uVar6;
  }
  puStack_7188 = (undefined8 *)0x13cb62;
  pcStack_7128 = pcVar20;
  uStack_7118 = uVar7;
  pcStack_7110 = pcVar13;
  uStack_7108 = uVar23;
  pcStack_b28 = __n;
  pcStack_b20 = pcVar27;
  pcStack_b18 = __buf;
  pcStack_b10 = __n_00;
  apcStack_b08[0] = (code *)&pcStack_940;
  bcon_extract_ctx_init(aDStack_7080);
  puStack_7148 = auStack_af8;
  uStack_7150 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_7128) {
    uVar3 = (uint)pcStack_7128;
    do {
      puStack_7188 = (undefined8 *)0x13cbce;
      __s = aDStack_7080;
      pcVar27 = pcVar21;
      cVar1 = bcon_extract_ctx_va(pcVar21,aDStack_7080,&uStack_7150);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        puStack_7188 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_71b0 = (code *)0x13cc03;
        __name = __s;
        pcStack_71a8 = pcVar21;
        uStack_71a0 = (ulong)uVar3;
        pcStack_7198 = pcVar26;
        pDStack_7190 = aDStack_7080;
        puStack_7188 = &uStack_7150;
        pcVar26 = (char *)strlen(pcVar27);
        pcStack_71b0 = (code *)0x13cc0e;
        pDVar22 = __s;
        sVar15 = strlen((char *)__s);
        if ((int)sVar15 + (int)pcVar26 < 499) {
          pcStack_71b0 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_71b0 = (code *)0x13cc38;
          strncat(__dest,pcVar27,(long)(int)pcVar26);
          pcStack_71b0 = (code *)0x13cc40;
          sVar16 = strlen(__dest);
          (__dest + sVar16)[0] = '/';
          (__dest + sVar16)[1] = '\0';
          pcStack_71b0 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar15);
          pcVar27 = __dest;
          do {
            if (*pcVar27 == '\\') {
              *pcVar27 = '/';
            }
            else if (*pcVar27 == '\0') {
              return;
            }
            pcVar27 = pcVar27 + 1;
          } while( true );
        }
        pcStack_71b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar9 = (ulong)extraout_EDX;
        pDStack_7478 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_746c = iVar2;
        sStack_71d0 = sVar15;
        pcStack_71c8 = pcVar26;
        pDStack_71c0 = __s;
        pcStack_71b8 = pcVar27;
        pcStack_71b0 = (code *)apcStack_b08;
        __dirp = opendir((char *)__name);
        pDVar24 = pDVar22;
        pDStack_7480 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_7478 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar17 = readdir(__dirp);
        if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar26 = "..";
        pDVar24 = (DIR *)0x147699;
        pDStack_7468 = pDVar22;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_7478 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar27,acStack_73d0);
  pDStack_7478 = (DIR *)0x13cd32;
  iVar5 = stat(pcVar27,&sStack_7460);
  if ((iVar5 == 0) && ((sStack_7460.st_mode & 0xf000) == 0x4000)) {
    pDStack_7478 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_7468,acStack_73d0,iVar2,iStack_746c);
    uVar9 = (ulong)uVar3;
  }
  else {
    pDStack_7478 = (DIR *)0x13cd73;
    pcVar13 = strstr(pcVar27,".json");
    if (pcVar13 != (char *)0x0) {
      uVar9 = (ulong)(iVar2 + 1);
      pDStack_7478 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar27,(char *)(pDStack_7468 + (long)iVar2 * 500));
    }
  }
  pDStack_7478 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar17 = readdir(__dirp);
  if (pdVar17 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_7478 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar9;
  if (iVar2 < iStack_746c) {
    do {
      pcVar27 = pdVar17->d_name;
      pDStack_7478 = (DIR *)0x13ccea;
      iVar5 = strcmp(pcVar27,"..");
      if (iVar5 != 0) {
        pDStack_7478 = (DIR *)0x13ccf9;
        iVar5 = strcmp(pcVar27,".");
        if (iVar5 != 0) goto LAB_0013cd12;
      }
      pDStack_7478 = (DIR *)0x13cd05;
      pdVar17 = readdir(__dirp);
      if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_7478 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_7480 = __dirp;
LAB_0013cdc9:
  pDStack_7478 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_7498 = uVar9;
  pDStack_7490 = pDVar24;
  pcStack_7488 = pcVar26;
  pDStack_7478 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar15 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar15) {
      pvVar8 = (void *)bson_malloc0(sVar15);
      sVar16 = fread(pvVar8,1,sVar15,__stream);
      if (sVar16 != sVar15) {
        abort();
      }
      fclose(__stream);
      if (pvVar8 != (void *)0x0) {
        lVar18 = bson_new_from_json(pvVar8,sVar15,auStack_7698);
        if (lVar18 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7690);
          abort();
        }
        bson_free(pvVar8);
      }
    }
  }
  return;
}

Assistant:

static void
test_double (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_double (&expected, "foo", -1, 1.1);
   BCON_APPEND (&bcon, "foo", BCON_DOUBLE (1.1));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}